

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O2

void __thiscall seq_precede_inc::seq_precede_inc(seq_precede_inc *this,vec<IntVar_*> *_xs)

{
  uint uVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint o;
  long lVar8;
  IntVar *pIVar9;
  uint uVar10;
  uint o_00;
  Tint local_74;
  vec<Tint> *local_70;
  vec<Tint> *local_68;
  vec<Tint> *local_60;
  vec<IntVar_*> *local_58;
  vec<Tint> *local_50;
  Tint *local_48;
  Tint *local_40;
  long local_38;
  
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__seq_precede_inc_001f0c50;
  local_58 = &this->xs;
  vec<IntVar*>::vec<IntVar*>((vec<IntVar*> *)local_58,_xs);
  local_60 = &this->first;
  local_74.v = 0;
  vec<Tint>::vec(local_60,(this->xs).sz + 1,&local_74);
  local_68 = &this->limit;
  local_74.v = (this->xs).sz;
  vec<Tint>::vec(local_68,local_74.v + 1,&local_74);
  local_70 = &this->first_val;
  local_74.v = 0;
  vec<Tint>::vec(local_70,(this->xs).sz,&local_74);
  local_50 = &this->limit_val;
  local_74.v = (this->xs).sz;
  vec<Tint>::vec(local_50,local_74.v,&local_74);
  o = (this->xs).sz;
  (this->max_val).v = o;
  *(undefined4 *)((long)&(this->limit_change).data + 4) = 0;
  this->max_def = 0;
  (this->first_change).sz = 0;
  *(undefined8 *)&(this->first_change).cap = 0;
  *(undefined8 *)((long)&(this->first_change).data + 4) = 0;
  *(undefined8 *)&(this->limit_change).cap = 0;
  (this->super_Propagator).priority = 3;
  Tint::operator=((this->first).data,-1);
  Tint::operator=((this->limit).data,(this->xs).sz + 1);
  local_40 = &this->max_val;
  local_48 = &this->max_def;
  lVar8 = 0;
  uVar6 = 0;
  if (0 < (int)o) {
    uVar6 = (ulong)o;
  }
  local_38 = uVar6 << 2;
  uVar10 = 1;
  iVar5 = 0;
  do {
    if (local_38 == lVar8) {
      Tint::operator=(local_40,uVar10 - 1);
      uVar10 = 0;
      do {
        o_00 = 0;
        while( true ) {
          if ((int)o < 1) {
            Tint::operator=(local_48,uVar10);
            return;
          }
          o = o - 1;
          pIVar9 = (this->xs).data[o];
          uVar1 = (pIVar9->min).v;
          uVar7 = uVar10;
          if ((int)uVar10 < (int)uVar1) {
            uVar7 = uVar1;
          }
          if ((int)o_00 < (int)uVar1) {
            o_00 = uVar1;
            uVar10 = uVar7;
          }
          if (o_00 == 0) break;
          uVar6 = (ulong)o_00;
          bVar3 = IntVar::indomain(pIVar9,uVar6);
          if (bVar3) {
            Tint::operator=((this->limit).data + uVar6,o);
            Tint::operator=((this->limit_val).data + o,o_00);
            if (((o == (this->first).data[uVar6].v) &&
                (pIVar9 = (this->xs).data[o], (pIVar9->min).v < (int)o_00)) &&
               (iVar5 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])
                                  (pIVar9,uVar6,0,1), (char)iVar5 == '\0')) goto LAB_0015a600;
            o_00 = o_00 - 1;
          }
        }
      } while( true );
    }
    pIVar9 = *(IntVar **)((long)(this->xs).data + lVar8 * 2);
    if ((int)uVar10 < (pIVar9->max).v) {
      iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar9,(long)(int)uVar10,0,1);
      if ((char)iVar4 == '\0') {
LAB_0015a600:
        puts("=====UNSATISFIABLE=====");
        printf("%% Top level failure!\n");
        exit(0);
      }
      pIVar9 = *(IntVar **)((long)(this->xs).data + lVar8 * 2);
    }
    bVar3 = IntVar::indomain(pIVar9,(long)(int)uVar10);
    if (bVar3) {
      Tint::operator=((this->first).data + uVar10,iVar5);
      Tint::operator=((Tint *)((long)&((this->first_val).data)->v + lVar8),uVar10);
      uVar10 = uVar10 + 1;
    }
    plVar2 = *(long **)((long)(this->xs).data + lVar8 * 2);
    (**(code **)(*plVar2 + 0x38))(plVar2,this,iVar5,1);
    iVar5 = iVar5 + 1;
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

seq_precede_inc(vec<IntVar*>& _xs)
			: xs(_xs),
				first(xs.size() + 1, 0),
				limit(xs.size() + 1, xs.size()),
				first_val(xs.size(), 0),
				limit_val(xs.size(), xs.size()),
				max_val(xs.size()),
				max_def(0) {
		const int sz = xs.size();
		priority = 3;

		// Set unused zero value out of range
		first[0] = -1;
		limit[0] = xs.size() + 1;

		int M = 1;
		// Initialize firsts.
		for (int ii = 0; ii < sz; ii++) {
			if (xs[ii]->setMaxNotR(M)) {
				if (!xs[ii]->setMax(M)) {
					TL_FAIL();
				}
			}
			if (xs[ii]->indomain(M)) {
				first[M] = ii;
				first_val[ii] = M;
				++M;
			}
			xs[ii]->attach(this, ii, EVENT_C);
		}
		max_val = M - 1;

		// check_firsts();

		// Initialize lasts.
		int m = 0;
		int k = 0;
		for (int ii = sz - 1; ii >= 0; --ii) {
			const int mx = xs[ii]->getMin();
			if (mx > k) {
				k = mx;
				if (mx > m) {
					m = mx;
				}
			}
			if ((k != 0) && xs[ii]->indomain(k)) {
				limit[k] = ii;
				limit_val[ii] = k;
				// Definite occurrence
				if (first[k] == ii && xs[ii]->setMinNotR(k)) {
					if (!xs[ii]->setMin(k)) {
						TL_FAIL();
					}
				}
				--k;
			}
		}
		max_def = m;
	}